

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidx_manager.c
# Opt level: O0

int write_cidx(int offset,opj_cio_t *cio,opj_image_t *image,opj_codestream_info_t cstr_info,
              int j2klen)

{
  opj_codestream_info_t cstr_info_00;
  opj_codestream_info_t cstr_info_01;
  opj_codestream_info_t cstr_info_02;
  opj_codestream_info_t cstr_info_03;
  opj_codestream_info_t cstr_info_04;
  int iVar1;
  int iVar2;
  void *pvVar3;
  int in_ECX;
  undefined8 in_RDX;
  opj_cio_t *in_RSI;
  undefined4 in_EDI;
  undefined1 in_stack_00000000 [80];
  undefined4 uStack0000000000000050;
  undefined4 uStack0000000000000054;
  undefined8 uStack0000000000000058;
  opj_bool EPHused;
  int num_box;
  opj_jp2_box_t *box;
  int lenp;
  int i;
  int len;
  opj_cio_t *in_stack_ffffffffffffff48;
  opj_cio_t *in_stack_ffffffffffffff50;
  opj_cio_t *in_stack_ffffffffffffff58;
  opj_cio_t *cio_00;
  undefined8 in_stack_ffffffffffffff60;
  opj_marker_info_t *markers;
  int coff;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 *puVar4;
  opj_bool in_stack_ffffffffffffffc8;
  int iVar5;
  int j2klen_00;
  int coff_00;
  int pos;
  int j2klen_01;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  
  puVar4 = (undefined8 *)&stack0x00000008;
  pos = -1;
  pvVar3 = calloc(0x20,0xc);
  j2klen_00 = (int)pvVar3;
  coff_00 = (int)((ulong)pvVar3 >> 0x20);
  for (j2klen_01 = 0; j2klen_01 < 2; j2klen_01 = j2klen_01 + 1) {
    if (j2klen_01 != 0) {
      cio_seek(in_RSI,pos);
    }
    pos = cio_tell(in_RSI);
    cio_skip(in_RSI,4);
    cio_write(in_stack_ffffffffffffff58,(unsigned_long_long)in_stack_ffffffffffffff50,
              (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    write_cptr((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(int)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
    write_manf((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(int)in_stack_ffffffffffffff60,
               (opj_jp2_box_t *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    iVar5 = 0;
    cstr_info_00._72_8_ = in_stack_ffffffffffffffb8;
    cstr_info_00._0_72_ = *(undefined1 (*) [72])(puVar4 + 5);
    cstr_info_00.marker = (opj_marker_info_t *)puVar4;
    cstr_info_00.maxmarknum = in_stack_ffffffffffffffc8;
    cstr_info_00.main_head_start = 0;
    cstr_info_00.main_head_end = j2klen_00;
    cstr_info_00.codestream_size = coff_00;
    cstr_info_00.tile._0_4_ = pos;
    cstr_info_00.tile._4_4_ = j2klen_01;
    iVar1 = write_mainmhix((int)((ulong)puVar4[3] >> 0x20),cstr_info_00,(opj_cio_t *)puVar4[2]);
    *(int *)(CONCAT44(coff_00,j2klen_00) + (long)iVar5 * 0xc) = iVar1;
    *(undefined4 *)(CONCAT44(coff_00,j2klen_00) + (long)iVar5 * 0xc + 4) = 0x6d686978;
    iVar5 = iVar5 + 1;
    cstr_info_01.D_max._4_4_ = in_ECX;
    cstr_info_01.D_max._0_4_ = in_stack_ffffffffffffffe0;
    cstr_info_01.packno = (int)in_RDX;
    cstr_info_01.index_write = (int)((ulong)in_RDX >> 0x20);
    cstr_info_01._16_8_ = in_RSI;
    cstr_info_01.prog = in_stack_fffffffffffffff8;
    cstr_info_01.tile_x = in_EDI;
    cstr_info_01._32_80_ = in_stack_00000000;
    iVar1 = write_tpix(coff_00,cstr_info_01,j2klen_00,
                       (opj_cio_t *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
    *(int *)(CONCAT44(coff_00,j2klen_00) + (long)iVar5 * 0xc) = iVar1;
    *(undefined4 *)(CONCAT44(coff_00,j2klen_00) + (long)iVar5 * 0xc + 4) = 0x74706978;
    iVar5 = iVar5 + 1;
    cio_00 = (opj_cio_t *)puVar4[2];
    iVar1 = (int)((ulong)puVar4[3] >> 0x20);
    markers = (opj_marker_info_t *)puVar4[4];
    coff = (int)((ulong)puVar4[5] >> 0x20);
    cstr_info_02.packno = in_stack_fffffffffffffff8;
    cstr_info_02.D_max = (double)in_RSI;
    cstr_info_02.index_write = in_EDI;
    cstr_info_02._16_80_ = in_stack_00000000;
    cstr_info_02.main_head_end = uStack0000000000000050;
    cstr_info_02.codestream_size = uStack0000000000000054;
    cstr_info_02.tile = (opj_tile_info_t *)uStack0000000000000058;
    iVar2 = write_thix(in_ECX,cstr_info_02,(opj_cio_t *)CONCAT44(j2klen_01,pos));
    *(int *)(CONCAT44(coff_00,j2klen_00) + (long)iVar5 * 0xc) = iVar2;
    *(undefined4 *)(CONCAT44(coff_00,j2klen_00) + (long)iVar5 * 0xc + 4) = 0x74686978;
    iVar5 = iVar5 + 1;
    in_stack_ffffffffffffffc8 = check_EPHuse(coff,markers,iVar1,cio_00);
    cstr_info_03.packno = in_stack_fffffffffffffff8;
    cstr_info_03.D_max = (double)in_RSI;
    cstr_info_03.index_write = in_EDI;
    cstr_info_03._16_80_ = in_stack_00000000;
    cstr_info_03.main_head_end = uStack0000000000000050;
    cstr_info_03.codestream_size = uStack0000000000000054;
    cstr_info_03.tile = (opj_tile_info_t *)uStack0000000000000058;
    iVar1 = write_ppix(in_ECX,cstr_info_03,in_stack_ffffffffffffffe0,j2klen_01,
                       (opj_cio_t *)CONCAT44(coff_00,j2klen_00));
    *(int *)(CONCAT44(coff_00,j2klen_00) + (long)iVar5 * 0xc) = iVar1;
    *(undefined4 *)(CONCAT44(coff_00,j2klen_00) + (long)iVar5 * 0xc + 4) = 0x70706978;
    iVar5 = iVar5 + 1;
    in_stack_ffffffffffffff48 = (opj_cio_t *)*puVar4;
    in_stack_ffffffffffffff50 = (opj_cio_t *)puVar4[1];
    in_stack_ffffffffffffff58 = (opj_cio_t *)puVar4[2];
    in_stack_ffffffffffffff60 = puVar4[3];
    cstr_info_04.packno = in_stack_fffffffffffffff8;
    cstr_info_04.D_max = (double)in_RSI;
    cstr_info_04.index_write = in_EDI;
    cstr_info_04._16_80_ = in_stack_00000000;
    cstr_info_04.main_head_end = uStack0000000000000050;
    cstr_info_04.codestream_size = uStack0000000000000054;
    cstr_info_04.tile = (opj_tile_info_t *)uStack0000000000000058;
    iVar1 = write_phix(in_ECX,cstr_info_04,in_stack_ffffffffffffffe0,j2klen_01,
                       (opj_cio_t *)CONCAT44(coff_00,j2klen_00));
    *(int *)(CONCAT44(coff_00,j2klen_00) + (long)iVar5 * 0xc) = iVar1;
    *(undefined4 *)(CONCAT44(coff_00,j2klen_00) + (long)iVar5 * 0xc + 4) = 0x70686978;
    in_stack_ffffffffffffffe0 = cio_tell(in_RSI);
    in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 - pos;
    cio_seek(in_RSI,pos);
    cio_write(in_stack_ffffffffffffff58,(unsigned_long_long)in_stack_ffffffffffffff50,
              (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    cio_seek(in_RSI,pos + in_stack_ffffffffffffffe0);
  }
  free((void *)CONCAT44(coff_00,j2klen_00));
  return in_stack_ffffffffffffffe0;
}

Assistant:

int write_cidx( int offset, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t cstr_info, int j2klen)
{
  int len, i, lenp;
  opj_jp2_box_t *box;
  int num_box = 0;
  opj_bool  EPHused;
  (void)image; /* unused ? */

  lenp = -1;
  box = (opj_jp2_box_t *)opj_calloc( 32, sizeof(opj_jp2_box_t));

  for (i=0;i<2;i++){
  
    if(i)
      cio_seek( cio, lenp);

    lenp = cio_tell( cio);

    cio_skip( cio, 4);              /* L [at the end] */
    cio_write( cio, JPIP_CIDX, 4);  /* CIDX           */
    write_cptr( offset, cstr_info.codestream_size, cio);

    write_manf( i, num_box, box, cio);
    
    num_box = 0;
    box[num_box].length = write_mainmhix( offset, cstr_info, cio);
    box[num_box].type = JPIP_MHIX;
    num_box++;

    box[num_box].length = write_tpix( offset, cstr_info, j2klen, cio);
    box[num_box].type = JPIP_TPIX;
    num_box++;
      
    box[num_box].length = write_thix( offset, cstr_info, cio);
    box[num_box].type = JPIP_THIX;
    num_box++;

    EPHused = check_EPHuse( offset, cstr_info.marker, cstr_info.marknum, cio);
      
    box[num_box].length = write_ppix( offset, cstr_info, EPHused, j2klen, cio);
    box[num_box].type = JPIP_PPIX;
    num_box++;
    
    box[num_box].length = write_phix( offset, cstr_info, EPHused, j2klen, cio);
    box[num_box].type = JPIP_PHIX;
    num_box++;
      
    len = cio_tell( cio)-lenp;
    cio_seek( cio, lenp);
    cio_write( cio, len, 4);        /* L             */
    cio_seek( cio, lenp+len);
  }

  opj_free( box);
  
  return len;
}